

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O3

StridedArrayView1D<const_std::uint32_t> * __thiscall
Corrade::Utility::JsonToken::asUnsignedIntArray
          (StridedArrayView1D<const_std::uint32_t> *__return_storage_ptr__,JsonToken *this,
          size_t expectedSize)

{
  long lVar1;
  unsigned_long value;
  ostream *poVar2;
  Debug *pDVar3;
  long lVar4;
  char *value_00;
  Error EStack_58;
  
  if (((uint)(this->_sizeFlagsParsedTypeType >> 0x3d) == 2) &&
     ((this->_sizeFlagsParsedTypeType & 0x1c00000000000000) != 0)) {
    value = (this->field_2)._childCount;
    if (value != 0) {
      lVar4 = 0x18;
      do {
        if ((*(ulong *)((long)&this->_sizeFlagsParsedTypeType + lVar4) & 0x1c00000000000000) !=
            0xc00000000000000) {
          poVar2 = Error::defaultOutput();
          Error::Error(&EStack_58,poVar2,(Flags)0x0);
          pDVar3 = Debug::operator<<(&EStack_58.super_Debug,
                                     "Utility::JsonToken::asUnsignedIntArray(): token");
          pDVar3 = Debug::operator<<(pDVar3,(lVar4 >> 3) * -0x5555555555555555 + -1);
          pDVar3 = Debug::operator<<(pDVar3,"is a");
          pDVar3 = Utility::operator<<(pDVar3,*(Type *)((long)&this->_sizeFlagsParsedTypeType +
                                                       lVar4) & (String|Object));
          pDVar3 = Debug::operator<<(pDVar3,"parsed as");
          Utility::operator<<(pDVar3,*(ParsedType *)((long)&this->_sizeFlagsParsedTypeType + lVar4)
                                     & Other);
          goto LAB_00136da7;
        }
        lVar1 = value * -0x18 + lVar4;
        lVar4 = lVar4 + 0x18;
      } while (lVar1 != 0);
    }
    if (value == expectedSize || expectedSize == 0) {
      __return_storage_ptr__->_data = &this[1].field_2;
      (__return_storage_ptr__->_size)._data[0] = value;
      (__return_storage_ptr__->_stride)._data[0] = 0x18;
      return __return_storage_ptr__;
    }
    poVar2 = Error::defaultOutput();
    Error::Error(&EStack_58,poVar2,(Flags)0x0);
    pDVar3 = Debug::operator<<(&EStack_58.super_Debug,
                               "Utility::JsonToken::asUnsignedIntArray(): expected a");
    pDVar3 = Debug::operator<<(pDVar3,expectedSize);
    (pDVar3->_immediateFlags)._value = (pDVar3->_immediateFlags)._value | 4;
    pDVar3 = Debug::operator<<(pDVar3,"-element array, got");
    Debug::operator<<(pDVar3,value);
  }
  else {
    poVar2 = Error::defaultOutput();
    Error::Error(&EStack_58,poVar2,(Flags)0x0);
    pDVar3 = Debug::operator<<(&EStack_58.super_Debug,
                               "Utility::JsonToken::asUnsignedIntArray(): token is");
    value_00 = "a parsed";
    if ((this->_sizeFlagsParsedTypeType & 0x1c00000000000000) == 0) {
      value_00 = "an unparsed";
    }
    pDVar3 = Debug::operator<<(pDVar3,value_00);
    Utility::operator<<(pDVar3,this->_sizeFlagsParsedTypeType & (String|Object));
  }
LAB_00136da7:
  Error::~Error(&EStack_58);
  abort();
}

Assistant:

Containers::StridedArrayView1D<const std::uint32_t> JsonToken::asUnsignedIntArray(const std::size_t expectedSize) const {
    CORRADE_ASSERT(type() == Type::Array && isParsed(),
        "Utility::JsonToken::asUnsignedIntArray(): token is" << (isParsed() ? "a parsed" : "an unparsed") << type(), {});

    const std::size_t size =
        #ifndef CORRADE_TARGET_32BIT
        _childCount
        #else
        _childCountFlagsTypeNan & ChildCountMask
        #endif
        ;
    #ifndef CORRADE_NO_ASSERT
    /* As this is expected to be a value array, we go by simple incrementing
       instead of with i->next(). If a nested object or array would be
       encountered, the parsedType() check fails. */
    for(const JsonToken *i = this + 1, *end = this + 1 + size; i != end; ++i)
        CORRADE_ASSERT(i->parsedType() == ParsedType::UnsignedInt,
            "Utility::JsonToken::asUnsignedIntArray(): token" << i - this - 1 << "is a" << i->type() << "parsed as" << i->parsedType(), {});
    /* Needs to be after the type-checking loop, otherwise the child count may
       include also nested tokens and the message would be confusing */
    CORRADE_ASSERT(!expectedSize || size == expectedSize,
        "Utility::JsonToken::asUnsignedIntArray(): expected a" << expectedSize << Debug::nospace << "-element array, got" << size, {});
    #else
    static_cast<void>(expectedSize);
    #endif

    return Containers::stridedArrayView(this + 1, size).slice(&JsonToken::_parsedUnsignedInt);
}